

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.pb.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::UInt32Value::_InternalSerialize
          (UInt32Value *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  ulong uVar1;
  uint8_t *puVar2;
  
  if ((this->field_0)._impl_.value_ != 0) {
    puVar2 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = internal::WireFormatLite::WriteUInt32ToArray(1,(this->field_0)._impl_.value_,puVar2);
  }
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    return target;
  }
  puVar2 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                     ((UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8),target,stream);
  return puVar2;
}

Assistant:

::uint8_t* UInt32Value::_InternalSerialize(
            ::uint8_t* target,
            ::google::protobuf::io::EpsCopyOutputStream* stream) const {
          const UInt32Value& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
          // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UInt32Value)
          ::uint32_t cached_has_bits = 0;
          (void)cached_has_bits;

          // uint32 value = 1;
          if (this_._internal_value() != 0) {
            target = stream->EnsureSpace(target);
            target = ::_pbi::WireFormatLite::WriteUInt32ToArray(
                1, this_._internal_value(), target);
          }

          if (PROTOBUF_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
            target =
                ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
                    this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
          }
          // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UInt32Value)
          return target;
        }